

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::addDays(QDate *this,qint64 ndays)

{
  long lVar1;
  QDate QVar2;
  
  QVar2.jd = -0x8000000000000000;
  lVar1 = this->jd;
  if (((0xfffffe92c1eb868b < lVar1 - 0xb69f248055U) && (!SCARRY8(lVar1,ndays))) &&
     (0xfffffe92c1eb868b < (lVar1 + ndays) - 0xb69f248055U)) {
    QVar2.jd = lVar1 + ndays;
  }
  return (QDate)QVar2.jd;
}

Assistant:

QDate QDate::addDays(qint64 ndays) const
{
    if (isNull())
        return QDate();

    if (qint64 r; Q_UNLIKELY(qAddOverflow(jd, ndays, &r)))
        return QDate();
    else
        return fromJulianDay(r);
}